

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

void __thiscall
deqp::RobustBufferAccessBehavior::Buffer::InitData
          (Buffer *this,GLenum target,GLenum usage,GLsizeiptr size,GLvoid *data)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  Functions *gl;
  undefined4 extraout_var_00;
  
  if (this->m_id != 0xffffffff) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,this);
    this->m_id = 0xffffffff;
  }
  this->m_target = target;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var_00,iVar1);
  Generate(gl,&this->m_id);
  (*gl->bindBuffer)(this->m_target,this->m_id);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x90);
  (*gl->bufferData)(this->m_target,size,data,usage);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0xac);
  return;
}

Assistant:

void Buffer::InitData(glw::GLenum target, glw::GLenum usage, glw::GLsizeiptr size, const glw::GLvoid* data)
{
	/* Delete previous buffer instance */
	Release();

	m_target = target;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	Generate(gl, m_id);
	Bind(gl, m_id, m_target);
	Data(gl, m_target, usage, size, data);
}